

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::setTimeZone(Calendar *this,TimeZone *zone)

{
  int iVar1;
  undefined4 extraout_var;
  TimeZone *zone_local;
  Calendar *this_local;
  
  iVar1 = (*(zone->super_UObject)._vptr_UObject[0xc])();
  adoptTimeZone(this,(TimeZone *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void
Calendar::setTimeZone(const TimeZone& zone)
{
    adoptTimeZone(zone.clone());
}